

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::process_context::process_context(process_context *this)

{
  string *this_00;
  _func_bool_void_ptr **__f;
  undefined1 *in_RDI;
  listener_type *default_listener;
  undefined1 __i;
  atomic<bool> *this_01;
  stack_type<cs_impl::any,_std::allocator> *in_stack_ffffffffffffff50;
  function<bool_(void_*)> *this_02;
  atomic<bool> local_70 [32];
  code *local_50;
  function<bool_(void_*)> local_48;
  allocator local_21;
  int local_20 [5];
  allocator local_9 [9];
  
  *in_RDI = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 8),"3.4.3 Castor fiber(Stable) Build 14",local_9)
  ;
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  local_20[0] = 0x3364c;
  numeric::numeric<int>((numeric *)(in_RDI + 0x30),local_20);
  *(undefined4 *)(in_RDI + 0x50) = 8;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  this_00 = (string *)(in_RDI + 0x58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,".",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  *(undefined8 *)(in_RDI + 0x78) = 1000;
  default_listener = (listener_type *)(in_RDI + 0x80);
  stack_type<cs_impl::any,_std::allocator>::stack_type(in_stack_ffffffffffffff50);
  __f = (_func_bool_void_ptr **)(in_RDI + 0xa8);
  local_50 = on_process_exit_default_handler;
  this_02 = &local_48;
  std::function<bool(void*)>::function<bool(*)(void*),void>(this_02,__f);
  event_type::event_type((event_type *)this_00,default_listener);
  std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x187423);
  __i = (undefined1)((ulong)(in_RDI + 0xd0) >> 0x38);
  this_01 = local_70;
  std::function<bool(void*)>::function<bool(*)(void*),void>(this_02,__f);
  event_type::event_type((event_type *)this_00,default_listener);
  std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x18746c);
  *(code **)(in_RDI + 0xf8) = std_defalt_exception_handler;
  *(code **)(in_RDI + 0x100) = cs_defalt_exception_handler;
  std::atomic<bool>::operator=(this_01,(bool)__i);
  return;
}

Assistant:

process_context() : on_process_exit(&on_process_exit_default_handler), on_process_sigint(&on_process_exit_default_handler)
		{
			is_sigint_raised = false;
		}